

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O3

void __thiscall QFontComboBoxPrivate::currentChanged(QFontComboBoxPrivate *this,QString *text)

{
  QObject *pQVar1;
  long lVar2;
  QArrayData *pQVar3;
  char cVar4;
  long lVar5;
  QFont *pQVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QArrayData *d;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  pQVar6 = &this->currentFont;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::families();
  if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
    pcVar7 = (text->d).ptr;
    lVar5 = (text->d).size;
  }
  else {
    lVar2 = ((local_78.ptr)->d).size;
    pcVar7 = (text->d).ptr;
    lVar5 = (text->d).size;
    if ((lVar2 == lVar5) &&
       (QVar8.m_data = ((local_78.ptr)->d).ptr, QVar8.m_size = lVar2, QVar9.m_data = pcVar7,
       QVar9.m_size = lVar2, cVar4 = QtPrivate::equalStrings(QVar8,QVar9), lVar5 = lVar2,
       cVar4 != '\0')) goto LAB_0040677b;
  }
  pQVar3 = &((text->d).d)->super_QArrayData;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_58,0x18,0x10,1,KeepSize);
  ((local_58.ptr)->d).d = (Data *)pQVar3;
  ((local_58.ptr)->d).ptr = pcVar7;
  ((local_58.ptr)->d).size = lVar5;
  if (pQVar3 == (QArrayData *)0x0) {
    local_58.size = 1;
    QFont::setFamilies((QList_conflict *)pQVar6);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  else {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_58.size = 1;
    QFont::setFamilies((QList_conflict *)pQVar6);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)pQVar6;
  QMetaObject::activate(pQVar1,&QFontComboBox::staticMetaObject,0,&local_58.d);
LAB_0040677b:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontComboBoxPrivate::currentChanged(const QString &text)
{
    Q_Q(QFontComboBox);
    const QStringList families = currentFont.families();
    if (families.isEmpty() || families.first() != text) {
        currentFont.setFamilies(QStringList{text});
        emit q->currentFontChanged(currentFont);
    }
}